

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDMeshFragment::Internal_GetFrameHelper
          (ON_SubDMeshFragment *this,uint P_dex,uint Q_dex,ON_Plane *frame)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ON_Plane *pOVar6;
  byte bVar7;
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dPoint P;
  ON_3dVector X;
  ON_3dVector V;
  ON_3dPoint Q;
  ON_Plane local_b0;
  
  bVar7 = 0;
  uVar3 = PointCount(this);
  if ((Q_dex < uVar3 && P_dex < uVar3) && (uVar4 = NormalCount(this), uVar4 == uVar3)) {
    VertexPoint(&P,this,P_dex);
    VertexNormal(&Z,this,P_dex);
    bVar2 = ON_3dPoint::IsValid(&P);
    if ((bVar2) && (bVar2 = ON_3dVector::IsNotZero(&Z), bVar2)) {
      VertexPoint(&Q,this,Q_dex);
      ON_3dPoint::operator-((ON_3dVector *)&local_b0,&Q,&P);
      ON_3dVector::UnitVector(&V,(ON_3dVector *)&local_b0);
      dVar1 = ON_3dVector::operator*(&Z,&V);
      ::operator*(&Y,dVar1,&Z);
      ON_3dVector::operator-((ON_3dVector *)&local_b0,&V,&Y);
      ON_3dVector::UnitVector(&X,(ON_3dVector *)&local_b0);
      ON_CrossProduct((ON_3dVector *)&local_b0,&Z,&X);
      ON_3dVector::UnitVector(&Y,(ON_3dVector *)&local_b0);
      bVar2 = ON_3dVector::IsUnitVector(&X);
      if ((((!bVar2) || (bVar2 = ON_3dVector::IsUnitVector(&Y), !bVar2)) ||
          (dVar1 = ON_3dVector::operator*(&X,&Z), 1.490116119385e-08 < ABS(dVar1))) ||
         (dVar1 = ON_3dVector::operator*(&Y,&Z), 1.490116119385e-08 < ABS(dVar1))) {
        ON_Plane::ON_Plane(&local_b0,&P,&Z);
        pOVar6 = &local_b0;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          (frame->origin).x = (pOVar6->origin).x;
          pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
          frame = (ON_Plane *)((long)frame + (ulong)bVar7 * -0x10 + 8);
        }
        ON_Plane::~ON_Plane(&local_b0);
      }
      else {
        (frame->origin).z = P.z;
        (frame->origin).x = P.x;
        (frame->origin).y = P.y;
        (frame->xaxis).z = X.z;
        (frame->xaxis).x = X.x;
        (frame->xaxis).y = X.y;
        (frame->yaxis).x = Y.x;
        (frame->yaxis).y = Y.y;
        (frame->yaxis).z = Y.z;
        (frame->zaxis).x = Z.x;
        (frame->zaxis).y = Z.y;
        (frame->zaxis).z = Z.z;
        ON_Plane::UpdateEquation(frame);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SubDMeshFragment::Internal_GetFrameHelper(
  unsigned int P_dex,
  unsigned int Q_dex,
  ON_Plane& frame
) const
{
  const unsigned int P_count = PointCount();
  if ( P_dex < P_count
    && Q_dex < P_count
    && NormalCount() == PointCount()
    )
  {
    const ON_3dPoint P(VertexPoint(P_dex));
    const ON_3dVector Z(VertexNormal(P_dex));
    if (P.IsValid() && Z.IsNotZero())
    {
      const ON_3dPoint Q(VertexPoint(Q_dex));
      const ON_3dVector V = (Q - P).UnitVector();
      const ON_3dVector X = (V - (Z*V)*Z).UnitVector();
      const ON_3dVector Y = ON_CrossProduct(Z, X).UnitVector();
      if ( X.IsUnitVector() && Y.IsUnitVector() 
        && fabs(X*Z) <= ON_SQRT_EPSILON
        && fabs(Y*Z) <= ON_SQRT_EPSILON
        )
      {
        frame.origin = P;
        frame.xaxis = X;
        frame.yaxis = Y;
        frame.zaxis = Z;
        frame.UpdateEquation();
      }
      else
      {
        frame = ON_Plane(P, Z);
      }
      return true;
    }
  }
  return false;
}